

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

wchar_t main(wchar_t argc,char **argv)

{
  undefined8 *puVar1;
  _Bool _Var2;
  bool bVar3;
  byte bVar4;
  wchar_t wVar5;
  int iVar6;
  _Bool *p_Var7;
  char *str;
  char *pcVar8;
  passwd *ppVar9;
  bool bVar10;
  game_mode_type mode;
  wchar_t wVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  char configpath [512];
  char libpath [512];
  wchar_t local_67c;
  char **local_678;
  char *local_670;
  char local_638 [511];
  undefined1 local_439;
  char local_438 [511];
  undefined1 local_239;
  char local_238 [511];
  undefined1 local_39;
  
  argv0 = *argv;
  umask(0x12);
  player_uid = getuid();
  safe_setuid_drop();
  my_strcpy(local_638,"./lib/",0x200);
  my_strcpy(local_238,"./lib/",0x200);
  my_strcpy(local_438,"./lib/",0x200);
  local_439 = 0;
  local_39 = 0;
  local_239 = 0;
  _Var2 = suffix(local_638,"/");
  if (!_Var2) {
    my_strcat(local_638,"/",0x200);
  }
  _Var2 = suffix(local_238,"/");
  if (!_Var2) {
    my_strcat(local_238,"/",0x200);
  }
  _Var2 = suffix(local_438,"/");
  if (!_Var2) {
    my_strcat(local_438,"/",0x200);
  }
  init_file_paths(local_638,local_238,local_438);
  local_67c = argc;
  local_678 = argv;
  if (argc < L'\x02') {
    bVar10 = true;
    pcVar14 = (char *)0x0;
    mode = GAME_LOAD;
  }
  else {
    wVar11 = L'\x01';
    bVar10 = true;
    local_670 = (char *)0x0;
    bVar3 = false;
    bVar4 = 0;
    do {
      pcVar8 = local_678[wVar11];
      pcVar14 = local_670;
      if (*pcVar8 != '-') {
        pcVar13 = pcVar8 + 1;
        goto switchD_00126607_caseD_65;
      }
      pcVar13 = pcVar8 + 2;
      switch(pcVar8[1]) {
      case 'c':
        bVar3 = true;
        break;
      case 'd':
        if (*pcVar13 == '\0') {
          quit_fmt("Try \'-d<dir>=<path>\'.");
        }
        pcVar8 = string_make(pcVar13);
        pcVar13 = strtok(pcVar8,"=");
        str = strtok((char *)0x0,"=");
        lVar12 = 8;
        do {
          wVar5 = my_stricmp(pcVar13,*(char **)(&UNK_002c8978 + lVar12));
          if (wVar5 == L'\0') {
            puVar1 = *(undefined8 **)((long)&change_path_values[0].name + lVar12);
            string_free((char *)*puVar1);
            pcVar13 = string_make(str);
            *puVar1 = pcVar13;
            path_build(local_638,0x200,str,"");
            _Var2 = dir_create(local_638);
            if (!_Var2) {
              quit_fmt("Cannot create \'%s\'",local_638);
            }
            string_free(pcVar8);
            goto LAB_001268c3;
          }
          lVar12 = lVar12 + 0x18;
        } while (lVar12 != 0x140);
        quit_fmt("Unrecognised -d parameter %s",pcVar13);
        goto LAB_001268c3;
      case 'e':
      case 'h':
      case 'i':
      case 'j':
      case 'k':
      case 'o':
      case 'p':
      case 'q':
      case 'r':
      case 's':
      case 't':
      case 'v':
        goto switchD_00126607_caseD_65;
      case 'f':
        p_Var7 = &arg_force_name;
        goto LAB_001266f3;
      case 'g':
        arg_graphics = L'\x02';
        if (*pcVar13 != '\0') {
          arg_graphics = atoi(pcVar13);
        }
        break;
      case 'l':
        list_saves();
        exit(0);
      case 'm':
        pcVar14 = pcVar13;
        if (*pcVar13 == '\0') goto switchD_00126607_caseD_65;
        goto LAB_001268c3;
      case 'n':
        bVar4 = 1;
        break;
      case 'u':
        if (*pcVar13 == '\0') goto switchD_00126607_caseD_65;
        my_strcpy(arg_name,pcVar13,0x20);
        savefile_set_name(pcVar13,false,false);
        goto LAB_001268c3;
      case 'w':
        p_Var7 = &arg_wizard;
LAB_001266f3:
        *p_Var7 = true;
        break;
      default:
        if (pcVar8[1] != '-') goto switchD_00126607_caseD_65;
        pcVar14 = *local_678;
        local_678 = local_678 + wVar11;
        *local_678 = pcVar14;
        local_67c = local_67c - wVar11;
        bVar10 = false;
      }
      while (pcVar14 = local_670, *pcVar13 != '\0') {
switchD_00126607_caseD_65:
        puts("Usage: angband [options] [-- subopts]");
        puts("  -c             Select savefile with a menu; overrides -n");
        puts(
            "  -n             Start a new character (WARNING: overwrites default savefile without -u)"
            );
        puts("  -l             Lists all savefiles you can play");
        puts("  -w             Resurrect dead character (marks savefile)");
        puts("  -g             Request graphics mode");
        puts("  -u<who>        Use your <who> savefile");
        puts("  -d<dir>=<path> Override a specific directory with <path>. <path> can be:");
        lVar12 = 8;
        do {
          printf("    %s (default is %s)\n",*(undefined8 *)(&UNK_002c8978 + lVar12),
                 **(undefined8 **)((long)&change_path_values[0].name + lVar12));
          lVar12 = lVar12 + 0x18;
        } while (lVar12 != 0x140);
        puts("                 Multiple -d options are allowed.");
        puts("  -m<sys>        Use module <sys>, where <sys> can be:");
        lVar12 = 8;
        do {
          printf("     %s   %s\n",*(undefined8 *)(&UNK_002c8ab8 + lVar12),
                 *(undefined8 *)((long)&modules[0].name + lVar12));
          lVar12 = lVar12 + 0x18;
        } while (lVar12 == 0x20);
        quit((char *)0x0);
        wVar11 = L'\x02';
      }
LAB_001268c3:
    } while ((bVar10) && (wVar11 = wVar11 + L'\x01', local_670 = pcVar14, wVar11 < local_67c));
    mode = GAME_SELECT;
    if (!bVar3) {
      mode = (uint)bVar4;
    }
  }
  if (bVar10) {
    local_678[1] = (char *)0x0;
    local_67c = L'\x01';
  }
  quit_aux = quit_hook;
  if (pcVar14 != (char *)0x0) {
    ANGBAND_SYS = pcVar14;
  }
  pcVar8 = setlocale(0,"");
  if (pcVar8 != (char *)0x0) {
    pcVar8 = nl_langinfo(0xe);
    iVar6 = strcmp(pcVar8,"UTF-8");
    if (iVar6 != 0) {
      quit("Angband requires UTF-8 support");
    }
  }
  if (arg_name[0] == '\0') {
    ppVar9 = getpwuid(player_uid);
    if (((ppVar9 == (passwd *)0x0) || (pcVar8 = ppVar9->pw_name, pcVar8 == (char *)0x0)) ||
       (*pcVar8 == '\0')) {
      my_strcpy(arg_name,"PLAYER",0x20);
    }
    else {
      my_strcpy(arg_name,pcVar8,0x20);
      my_strcap(arg_name);
    }
    savefile_set_name(arg_name,true,false);
  }
  create_needed_dirs();
  lVar12 = 0;
  do {
    if ((pcVar14 == (char *)0x0) ||
       (iVar6 = strcmp(pcVar14,*(char **)((long)&modules[0].name + lVar12)), iVar6 == 0)) {
      ANGBAND_SYS = *(char **)((long)&modules[0].name + lVar12);
      iVar6 = (**(code **)((long)&modules[0].init + lVar12))(local_67c,local_678);
      if (iVar6 == 0) goto LAB_00126a46;
    }
    lVar12 = lVar12 + 0x18;
  } while (lVar12 == 0x18);
  quit("Unable to prepare any \'display module\'!");
LAB_00126a46:
  signals_init();
  cmd_get_hook = textui_get_cmd;
  reinit_hook = generic_reinit;
  init_display();
  init_angband();
  textui_init();
  pause_line(Term);
  play_game(mode);
  textui_cleanup();
  cleanup_angband();
  quit((char *)0x0);
  return L'\0';
}

Assistant:

int main(int argc, char *argv[])
{
	int i;
	bool new_game = false, select_game = false;
	bool done = false;

	const char *mstr = NULL;
	bool args = true;

	/* Save the "program name" XXX XXX XXX */
	argv0 = argv[0];

#ifdef UNIX

	/* Default permissions on files */
	(void)umask(022);

	/* Get the user id */
	player_uid = getuid();

#endif /* UNIX */

#ifdef SETGID

	/* Save the effective GID for later recall */
	player_egid = getegid();

#endif /* UNIX */


	/* Drop permissions */
	safe_setuid_drop();

	/* Get the file paths 
	 * Paths may be overriden by -d options, so this has to occur *before* 
	 * processing command line args */
	init_stuff();

	/* Process the command line arguments */
	for (i = 1; args && (i < argc); i++) {
		const char *arg = argv[i];

		/* Require proper options */
		if (*arg++ != '-') goto usage;

		/* Analyze option */
		switch (*arg++)
		{
			case 'c':
				select_game = true;
				break;

			case 'l':
				list_saves();
				exit(0);

			case 'n':
				new_game = true;
				break;

			case 'w':
				arg_wizard = true;
				break;

			case 'g':
				/* Default graphics tile */
				/* in graphics.txt, 2 corresponds to adam bolt's tiles */
				arg_graphics = 2; 
				if (*arg) arg_graphics = atoi(arg);
				break;

			case 'u': {
				if (!*arg) goto usage;

				my_strcpy(arg_name, arg, sizeof(arg_name));

				/* The difference here is because on setgid we have to be
				 * careful to only let the player have savefiles stored in
				 * the central save directory.  Sanitising input using
				 * player_safe_name() removes anything like that.
				 *
				 * But if the player is running with per-user saves, they
				 * can do whatever the hell they want.
				 */
#ifdef SETGID
				savefile_set_name(arg, true, false);
#else
				savefile_set_name(arg, false, false);
#endif /* SETGID */

				continue;
			}

			case 'f':
				arg_force_name = true;
				break;

			case 'm':
				if (!*arg) goto usage;
				mstr = arg;
				continue;
#ifdef SOUND
			case 's':
				if (!*arg) goto usage;
				soundstr = arg;
				continue;
#endif
			case 'd':
				change_path(arg);
				continue;

			case '-':
				argv[i] = argv[0];
				argc = argc - i;
				argv = argv + i;
				args = false;
				break;

			default:
			usage:
				puts("Usage: angband [options] [-- subopts]");
				puts("  -c             Select savefile with a menu; overrides -n");
				puts("  -n             Start a new character (WARNING: overwrites default savefile without -u)");
				puts("  -l             Lists all savefiles you can play");
				puts("  -w             Resurrect dead character (marks savefile)");
				puts("  -g             Request graphics mode");
				puts("  -u<who>        Use your <who> savefile");
				puts("  -d<dir>=<path> Override a specific directory with <path>. <path> can be:");
				for (i = 0; i < (int)N_ELEMENTS(change_path_values); i++) {
#ifdef SETGID
					if (!change_path_values[i].setgid_ok) continue;
#endif
					printf("    %s (default is %s)\n", change_path_values[i].name, *change_path_values[i].path);
				}
				puts("                 Multiple -d options are allowed.");
#ifdef SOUND
				puts("  -s<mod>        Use sound module <sys>:");
				print_sound_help();
#endif
				puts("  -m<sys>        Use module <sys>, where <sys> can be:");

				/* Print the name and help for each available module */
				for (i = 0; i < (int)N_ELEMENTS(modules); i++)
					printf("     %s   %s\n",
					       modules[i].name, modules[i].help);

				/* Actually abort the process */
				quit(NULL);
		}
		if (*arg) goto usage;
	}

	/* Hack -- Forget standard args */
	if (args) {
		argc = 1;
		argv[1] = NULL;
	}

	/* Install "quit" hook */
	quit_aux = quit_hook;

	/* If we were told which mode to use, then use it */
	if (mstr)
		ANGBAND_SYS = mstr;
#if !defined(WINDOWS) && !defined(DJGPP)
	if (setlocale(LC_CTYPE, "")) {
		/* Require UTF-8 */
		if (!streq(nl_langinfo(CODESET), "UTF-8"))
			quit("Angband requires UTF-8 support");
	}
#endif

#ifdef UNIX

	/* Get the "user name" as default player name, unless set with -u switch */
	if (!arg_name[0]) {
		user_name(arg_name, sizeof(arg_name), player_uid);

		/* Sanitise name and set as savefile */
		savefile_set_name(arg_name, true, false);
	}

	/* Create any missing directories */
	create_needed_dirs();

#endif /* UNIX */

	/* Try the modules in the order specified by modules[] */
	for (i = 0; i < (int)N_ELEMENTS(modules); i++) {
		/* User requested a specific module? */
		if (!mstr || (streq(mstr, modules[i].name))) {
			ANGBAND_SYS = modules[i].name;
			if (0 == modules[i].init(argc, argv)) {
				done = true;
				break;
			}
		}
	}

	/* Make sure we have a display! */
	if (!done) quit("Unable to prepare any 'display module'!");

	/* Catch nasty signals */
	signals_init();

	/* Set up the command hook */
	cmd_get_hook = textui_get_cmd;

	/*
	 * Set action that needs to be done if restarting without exiting.
	 * Also need to do it now.
	 */
#ifdef SOUND
	saved_argc = argc;
	saved_argv = argv;
#endif
	reinit_hook = generic_reinit;
	generic_reinit();

	/* Set up the display handlers and things. */
	init_display();
	init_angband();
	textui_init();

	/* Wait for response */
	pause_line(Term);

	/* Play the game */
	play_game((select_game) ?
		GAME_SELECT : ((new_game) ? GAME_NEW : GAME_LOAD));

	/* Free resources */
	textui_cleanup();
	cleanup_angband();
#ifdef SOUND
	close_sound();
#endif

	/* Quit */
	quit(NULL);

	/* Exit */
	return (0);
}